

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O0

pair<std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_>
* __thiscall jsonnet::internal::SortImports::splitFodder(SortImports *this,Fodder *fodder)

{
  bool bVar1;
  reference a;
  reference pvVar2;
  undefined8 in_RDX;
  pair<std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_>
  *in_RDI;
  FodderElement *fodderElem;
  const_iterator __end2;
  const_iterator __begin2;
  Fodder *__range2;
  bool inSecondPart;
  Fodder beforeNext;
  Fodder afterPrev;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_stack_ffffffffffffff38;
  uint *in_stack_ffffffffffffff40;
  value_type *in_stack_ffffffffffffff48;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_stack_ffffffffffffff50;
  pair<std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_>
  *this_00;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  local_98;
  undefined4 local_80;
  FodderElement *in_stack_ffffffffffffff88;
  __normal_iterator<const_jsonnet::internal::FodderElement_*,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_>
  local_60;
  undefined8 local_58;
  byte local_49;
  undefined8 local_18;
  
  this_00 = in_RDI;
  local_18 = in_RDX;
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *)0x2bc649);
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *)0x2bc656);
  local_49 = 0;
  local_58 = local_18;
  local_60._M_current =
       (FodderElement *)
       std::
       vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
       begin(in_stack_ffffffffffffff38);
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  end(in_stack_ffffffffffffff38);
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_jsonnet::internal::FodderElement_*,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_>
                        *)in_stack_ffffffffffffff40,
                       (__normal_iterator<const_jsonnet::internal::FodderElement_*,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_>
                        *)in_stack_ffffffffffffff38);
    if (!bVar1) {
      std::
      pair<std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_>
      ::
      pair<std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_&,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_&,_true>
                (this_00,&in_RDI->first,in_stack_ffffffffffffff50);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector(in_stack_ffffffffffffff50);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector(in_stack_ffffffffffffff50);
      return this_00;
    }
    a = __gnu_cxx::
        __normal_iterator<const_jsonnet::internal::FodderElement_*,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_>
        ::operator*(&local_60);
    if ((local_49 & 1) == 0) {
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      push_back(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    }
    else {
      fodder_push_back((Fodder *)a,in_stack_ffffffffffffff88);
    }
    if (((a->kind != INTERSTITIAL) && ((local_49 & 1) == 0)) && (local_49 = 1, a->blanks != 0)) {
      pvVar2 = std::
               vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               ::back((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)in_stack_ffffffffffffff40);
      pvVar2->blanks = 0;
      bVar1 = std::
              vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              ::empty(in_stack_ffffffffffffff50);
      if (!bVar1) {
        __assert_fail("beforeNext.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/formatter.cpp"
                      ,0x866,
                      "std::pair<Fodder, Fodder> jsonnet::internal::SortImports::splitFodder(const Fodder &)"
                     );
      }
      local_80 = 0;
      in_stack_ffffffffffffff40 = &a->blanks;
      in_stack_ffffffffffffff48 = (value_type *)&a->indent;
      local_98.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_98.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_98.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      in_stack_ffffffffffffff50 = &local_98;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x2bc7aa);
      std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>
      ::
      emplace_back<jsonnet::internal::FodderElement::Kind,unsigned_int_const&,unsigned_int_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                (&this_00->first,(Kind *)in_RDI,(uint *)in_stack_ffffffffffffff50,
                 &in_stack_ffffffffffffff48->kind,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffff40);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_ffffffffffffff50);
    }
    __gnu_cxx::
    __normal_iterator<const_jsonnet::internal::FodderElement_*,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_>
    ::operator++(&local_60);
  } while( true );
}

Assistant:

std::pair<Fodder, Fodder> splitFodder(const Fodder &fodder)
    {
        Fodder afterPrev, beforeNext;
        bool inSecondPart = false;
        for (const auto &fodderElem : fodder) {
            if (inSecondPart) {
                fodder_push_back(beforeNext, fodderElem);
            } else {
                afterPrev.push_back(fodderElem);
            }
            if (fodderElem.kind != FodderElement::Kind::INTERSTITIAL && !inSecondPart) {
                inSecondPart = true;
                if (fodderElem.blanks > 0) {
                    // If there are any blank lines at the end of afterPrev, move them
                    // to beforeNext.
                    afterPrev.back().blanks = 0;
                    assert(beforeNext.empty());
                    beforeNext.emplace_back(FodderElement::Kind::LINE_END,
                                            fodderElem.blanks,
                                            fodderElem.indent,
                                            std::vector<std::string>());
                }
            }
        }
        return {afterPrev, beforeNext};
    }